

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int handle_connection(int fd,ptls_context_t *ctx,char *server_name,
                     ptls_handshake_properties_t *hsprop)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  ptls_t *tls;
  ulong uVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  char *__format;
  ulong uVar8;
  ptls_buffer_t wbuf;
  fd_set readfds;
  uint8_t rbuf [1024];
  uint8_t early_data [1024];
  uint8_t wbuf_small [1024];
  size_t local_cf0;
  ptls_buffer_t local_ce8;
  ulong local_cc0;
  fd_set local_cb8;
  uint8_t local_c38 [1024];
  undefined1 local_838 [1024];
  uint8_t local_438 [1032];
  
  tls = ptls_new(ctx,server_name);
  if ((server_name == (char *)0x0) || ((hsprop->client).max_early_data_size == (size_t *)0x0)) {
    uVar8 = 0;
  }
  else {
    uVar4 = read(0,local_838,0x400);
    uVar8 = 0;
    if (0 < (long)uVar4) {
      uVar8 = uVar4;
    }
  }
  local_ce8.base = local_438;
  local_ce8.off = 0;
  local_ce8.capacity = 0x400;
  local_ce8._24_8_ = (ulong)(uint)local_ce8._28_4_ << 0x20;
  sVar5 = 0;
  local_cc0 = uVar8;
  while (local_cf0 = sVar5, uVar1 = ptls_handshake(tls,&local_ce8,local_c38,&local_cf0,hsprop),
        uVar1 == 0x202) {
    if ((((uVar8 != 0) && ((hsprop->client).max_early_data_size != (ulong *)0x0)) &&
        (uVar8 <= *(hsprop->client).max_early_data_size)) &&
       (uVar1 = ptls_send(tls,&local_ce8,local_838,uVar8), uVar1 != 0)) {
      __format = "ptls_send(early_data): %d\n";
      goto LAB_0010459e;
    }
    iVar2 = write_all(fd,local_ce8.base,local_ce8.off);
    if (iVar2 != 0) goto LAB_001045a5;
    local_ce8.off = 0;
    while (sVar5 = read(fd,local_c38,0x400), sVar5 == 0xffffffffffffffff) {
      piVar6 = __errno_location();
      if (*piVar6 != 4) goto LAB_001045a5;
    }
    uVar8 = 0;
    if ((long)sVar5 < 1) goto LAB_001045a5;
  }
  iVar2 = write_all(fd,local_ce8.base,local_ce8.off);
  if (iVar2 == 0) {
    if (uVar1 != 0) {
      __format = "ptls_handshake:%d\n";
      goto LAB_0010459e;
    }
    sVar5 = sVar5 - local_cf0;
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else {
      memmove(local_c38,local_c38 + local_cf0,sVar5);
    }
    local_ce8.off = 0;
    local_cf0 = sVar5;
    if ((local_cc0 != 0) && ((*(byte *)((long)hsprop + 0x18) & 1) == 0)) {
      uVar1 = ptls_send(tls,&local_ce8,local_838,local_cc0);
      if (uVar1 != 0) goto LAB_0010458b;
      iVar2 = write_all(fd,local_ce8.base,local_ce8.off);
      if (iVar2 != 0) goto LAB_001045a5;
    }
    local_ce8.off = 0;
    iVar2 = decrypt_and_print(tls,local_c38,local_cf0);
    if (iVar2 == 0) {
      local_cf0 = 0;
      iVar2 = fd + 0x3f;
      if (-1 < fd) {
        iVar2 = fd;
      }
      uVar8 = 1L << ((byte)(fd % 0x40) & 0x3f);
      goto LAB_0010445f;
    }
  }
LAB_001045a5:
  ptls_buffer__release_memory(&local_ce8);
  local_ce8.off = 0;
  local_ce8.is_allocated = 0;
  local_ce8._28_4_ = 0;
  local_ce8.base = (uint8_t *)0x0;
  local_ce8.capacity = 0;
  ptls_free(tls);
  return extraout_EAX;
LAB_0010445f:
  do {
    local_cb8.fds_bits[0xd] = 0;
    local_cb8.fds_bits[0xe] = 0;
    local_cb8.fds_bits[0xb] = 0;
    local_cb8.fds_bits[0xc] = 0;
    local_cb8.fds_bits[9] = 0;
    local_cb8.fds_bits[10] = 0;
    local_cb8.fds_bits[7] = 0;
    local_cb8.fds_bits[8] = 0;
    local_cb8.fds_bits[5] = 0;
    local_cb8.fds_bits[6] = 0;
    local_cb8.fds_bits[3] = 0;
    local_cb8.fds_bits[4] = 0;
    local_cb8.fds_bits[1] = 0;
    local_cb8.fds_bits[2] = 0;
    local_cb8.fds_bits[0xf] = 0;
    local_cb8.fds_bits[0] = 1;
    local_cb8.fds_bits[iVar2 >> 6] = local_cb8.fds_bits[iVar2 >> 6] | uVar8;
    iVar3 = select(fd + 1,&local_cb8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
  } while (iVar3 < 1);
  if ((local_cb8.fds_bits[0] & 1U) != 0) {
    do {
      sVar7 = read(0,local_c38,0x400);
      if (sVar7 != 1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    uVar1 = ptls_send(tls,&local_ce8,local_c38,sVar7);
    if (uVar1 != 0) goto LAB_0010458b;
    iVar3 = write_all(fd,local_ce8.base,local_ce8.off);
    if (iVar3 != 0) goto LAB_001045a5;
    local_ce8.off = 0;
  }
  if ((local_cb8.fds_bits[iVar2 >> 6] & uVar8) != 0) {
    do {
      sVar7 = read(fd,local_c38,0x400);
      if (sVar7 != 1) {
        if ((long)sVar7 < 1) goto LAB_001045a5;
        break;
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    iVar3 = decrypt_and_print(tls,local_c38,sVar7);
    if (iVar3 != 0) goto LAB_001045a5;
  }
  goto LAB_0010445f;
LAB_0010458b:
  __format = "ptls_send:%d\n";
LAB_0010459e:
  fprintf(_stderr,__format,(ulong)uVar1);
  goto LAB_001045a5;
}

Assistant:

static int handle_connection(int fd, ptls_context_t *ctx, const char *server_name, ptls_handshake_properties_t *hsprop)
{
    ptls_t *tls = ptls_new(ctx, server_name);
    uint8_t rbuf[1024], wbuf_small[1024], early_data[1024];
    ptls_buffer_t wbuf;
    int ret;
    size_t early_data_size = 0, roff;
    ssize_t rret;

    if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
        /* using early data */
        if ((rret = read(0, early_data, sizeof(early_data))) > 0)
            early_data_size = rret;
    }

    ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));

    roff = sizeof(rbuf);
    if (run_handshake(fd, tls, &wbuf, rbuf, &roff, hsprop, ptls_iovec_init(early_data, early_data_size)) != 0)
        goto Exit;
    wbuf.off = 0;

    /* re-send early data if necessary */
    if (early_data_size != 0 && !hsprop->client.early_data_accepted_by_peer) {
        if ((ret = ptls_send(tls, &wbuf, early_data, early_data_size)) != 0) {
            fprintf(stderr, "ptls_send:%d\n", ret);
            goto Exit;
        }
        if (write_all(fd, wbuf.base, wbuf.off) != 0)
            goto Exit;
        wbuf.off = 0;
    }

    /* process pending post-handshake data (if any) */
    if (decrypt_and_print(tls, rbuf, roff) != 0)
        goto Exit;
    roff = 0;

    /* do the communication */
    while (1) {

        /* wait for either of STDIN or read-side of the socket to become available */
        fd_set readfds;
        FD_ZERO(&readfds);
        FD_SET(0, &readfds);
        FD_SET(fd, &readfds);
        if (select(fd + 1, &readfds, NULL, NULL, NULL) <= 0)
            continue;

        if (FD_ISSET(0, &readfds)) {
            /* read from stdin, encrypt and send */
            while ((rret = read(0, rbuf, sizeof(rbuf))) == 1 && errno == EINTR)
                ;
            if ((ret = ptls_send(tls, &wbuf, rbuf, rret)) != 0) {
                fprintf(stderr, "ptls_send:%d\n", ret);
                goto Exit;
            }
            if (write_all(fd, wbuf.base, wbuf.off) != 0)
                goto Exit;
            wbuf.off = 0;
        }

        if (FD_ISSET(fd, &readfds)) {
            /* read from socket, decrypt and print */
            while ((rret = read(fd, rbuf, sizeof(rbuf))) == 1 && errno == EINTR)
                ;
            if (rret <= 0)
                goto Exit;
            if (decrypt_and_print(tls, rbuf, rret) != 0)
                goto Exit;
        }
    }

Exit:
    ptls_buffer_dispose(&wbuf);
    ptls_free(tls);
    return 0;
}